

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_softlocks.hpp
# Opt level: O2

void PatchFixSoftlocks::fix_fara_arena_chest_softlock(ROM *rom,World *world)

{
  uint32_t address;
  Map *this;
  Entity *pEVar1;
  Code *pCVar2;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  allocator_type local_1ca;
  allocator_type local_1c9;
  _Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> local_1c8;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_1b0;
  undefined1 local_198 [24];
  undefined3 uStack_180;
  undefined5 uStack_17d;
  undefined **local_178;
  _Base_ptr p_Stack_170;
  _Base_ptr local_168;
  _Base_ptr p_Stack_160;
  undefined **local_158;
  undefined1 auStack_150 [8];
  _Rb_tree_node_base local_148;
  undefined **local_128;
  undefined1 local_120;
  Code func;
  AddressRegister local_98;
  undefined **local_88;
  undefined1 local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined **local_68;
  undefined1 local_60;
  undefined **local_58;
  undefined1 local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined **local_38;
  undefined1 local_30;
  
  this = World::map(world,0x1c);
  pEVar1 = Map::entity(this,'\x0e');
  (pEVar1->_attrs).position.x = '\x1a';
  (pEVar1->_attrs).position.y = '\x13';
  (pEVar1->_attrs).position.z = '\x04';
  (pEVar1->_attrs).behavior_id = 0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR_getXn_00246bf0;
  uStack_180._0_1_ = 1;
  local_198._16_8_ = &PTR_getXn_00246bf0;
  p_Stack_170._0_1_ = 2;
  local_178 = &PTR_getXn_00246bf0;
  p_Stack_160._0_1_ = 3;
  local_168 = (_Base_ptr)&PTR_getXn_00246bf0;
  auStack_150[0] = 4;
  local_158 = &PTR_getXn_00246bf0;
  local_148._M_parent._0_1_ = 5;
  local_148._0_8_ = &PTR_getXn_00246bf0;
  local_148._M_right._0_1_ = 6;
  local_148._M_left = (_Base_ptr)&PTR_getXn_00246bf0;
  local_120 = 7;
  local_128 = &PTR_getXn_00246bf0;
  __l._M_len = 8;
  __l._M_array = (iterator)local_198;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_1c8,__l,
             &local_1c9);
  local_98.super_Register._code = '\0';
  local_98.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  local_80 = 1;
  local_88 = &PTR_getXn_00246c60;
  local_70 = 2;
  local_78 = &PTR_getXn_00246c60;
  local_60 = 3;
  local_68 = &PTR_getXn_00246c60;
  local_50 = 4;
  local_58 = &PTR_getXn_00246c60;
  local_40 = 5;
  local_48 = &PTR_getXn_00246c60;
  local_30 = 6;
  local_38 = &PTR_getXn_00246c60;
  __l_00._M_len = 7;
  __l_00._M_array = &local_98;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_1b0,__l_00,
             &local_1ca);
  md::Code::movem_to_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_1c8,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_1b0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_1b0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_1c8);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR_getXn_00246c60;
  md::Code::lea(&func,0xff5480,(AddressRegister *)local_198);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR_getXn_00246bf0;
  md::Code::moveq(&func,'\r',(DataRegister *)local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"loop_remove_entities",(allocator<char> *)&local_98);
  md::Code::label(&func,(string *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  local_198._0_8_ = &PTR_getXn_00246d28;
  local_198._16_8_ = local_198._16_8_ & 0xffffffffffffff00;
  local_198._8_8_ = &PTR_getXn_00246c60;
  uStack_180 = 0x20000;
  md::Code::movew(&func,0x7f7f,(Param *)local_198);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR_getXn_00246c60;
  md::Code::adda(&func,0x80,(AddressRegister *)local_198);
  local_98.super_Register._code = '\0';
  local_98.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"loop_remove_entities",(allocator<char> *)&local_1c8);
  md::Code::dbra(&func,(DataRegister *)&local_98,(string *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR_getXn_00246bf0;
  uStack_180._0_1_ = 1;
  local_198._16_8_ = &PTR_getXn_00246bf0;
  p_Stack_170 = (_Base_ptr)CONCAT71(p_Stack_170._1_7_,2);
  local_178 = &PTR_getXn_00246bf0;
  p_Stack_160 = (_Base_ptr)CONCAT71(p_Stack_160._1_7_,3);
  local_168 = (_Base_ptr)&PTR_getXn_00246bf0;
  auStack_150[0] = 4;
  local_158 = &PTR_getXn_00246bf0;
  local_148._M_parent = (_Base_ptr)CONCAT71(local_148._M_parent._1_7_,5);
  local_148._0_8_ = &PTR_getXn_00246bf0;
  local_148._M_right = (_Base_ptr)CONCAT71(local_148._M_right._1_7_,6);
  local_148._M_left = (_Base_ptr)&PTR_getXn_00246bf0;
  local_120 = 7;
  local_128 = &PTR_getXn_00246bf0;
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)local_198;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_1c8,__l_01,
             &local_1c9);
  local_98.super_Register._code = '\0';
  local_98.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  local_80 = 1;
  local_88 = &PTR_getXn_00246c60;
  local_70 = 2;
  local_78 = &PTR_getXn_00246c60;
  local_60 = 3;
  local_68 = &PTR_getXn_00246c60;
  local_50 = 4;
  local_58 = &PTR_getXn_00246c60;
  local_40 = 5;
  local_48 = &PTR_getXn_00246c60;
  local_30 = 6;
  local_38 = &PTR_getXn_00246c60;
  __l_02._M_len = 7;
  __l_02._M_array = &local_98;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_1b0,__l_02,
             &local_1ca);
  md::Code::movem_from_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_1c8,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_1b0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_1b0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_1c8);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"",(allocator<char> *)&local_98);
  address = md::ROM::inject_code(rom,&func,(string *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  local_168 = (_Base_ptr)&local_178;
  local_148._M_parent = (_Base_ptr)0x0;
  local_158 = (undefined **)0x0;
  auStack_150 = (undefined1  [8])0x0;
  local_178 = (undefined **)0x0;
  p_Stack_170 = (_Base_ptr)0x0;
  local_198._16_8_ = 0;
  _uStack_180 = 0;
  local_198._0_8_ = (_func_int **)0x0;
  local_198._8_8_ = (pointer)0x0;
  local_148._M_left = &local_148;
  local_148._M_color = _S_red;
  local_148._4_4_ = 0;
  local_128 = (undefined **)0x0;
  p_Stack_160 = local_168;
  local_148._M_right = local_148._M_left;
  pCVar2 = md::Code::jsr((Code *)local_198,address);
  pCVar2 = md::Code::nop(pCVar2,1);
  md::ROM::set_code(rom,0x19be0,pCVar2);
  md::Code::~Code((Code *)local_198);
  md::Code::~Code(&func);
  return;
}

Assistant:

static void fix_fara_arena_chest_softlock(md::ROM& rom, const World& world)
    {
        // Move the chest to the ground
        Entity* chest = world.map(MAP_SWAMP_SHRINE_BOSS_ROOM)->entity(14);
        chest->position(26, 19, 4);
        chest->behavior_id(0);

        // Function to remove all entities but the chest when coming back in the room
        md::Code func;
        func.movem_to_stack({ reg_D0_D7 }, { reg_A0_A6 });
        {
            func.lea(0xFF5480, reg_A0);
            func.moveq(0xD, reg_D0);
            func.label("loop_remove_entities");
            {
                func.movew(0x7F7F, addr_(reg_A0));
                func.adda(0x80, reg_A0);
            }
            func.dbra(reg_D0, "loop_remove_entities");
        }
        func.movem_from_stack({ reg_D0_D7 }, { reg_A0_A6 });
        func.rts();

        uint32_t addr = rom.inject_code(func);

        // Call the injected function
        rom.set_code(0x019BE0, md::Code().jsr(addr).nop());
    }